

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall FString::FString(FString *this,char oneChar)

{
  char oneChar_local;
  FString *this_local;
  
  if (oneChar == '\0') {
    NullString.RefCount = NullString.RefCount + 1;
    this->Chars = (char *)0xa28dbc;
  }
  else {
    AllocBuffer(this,1);
    *this->Chars = oneChar;
    this->Chars[1] = '\0';
  }
  return;
}

Assistant:

FString::FString (char oneChar)
{
	if (oneChar == '\0')
	{
		NullString.RefCount++;
		Chars = &NullString.Nothing[0];
	}
	else
	{
		AllocBuffer (1);
		Chars[0] = oneChar;
		Chars[1] = '\0';
	}
}